

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O2

void __thiscall llvm::SmallPtrSetImplBase::shrink_and_clear(SmallPtrSetImplBase *this)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  void **__s;
  
  if (this->CurArray != this->SmallArray) {
    free(this->CurArray);
    uVar3 = this->NumNonEmpty - this->NumTombstones;
    if (uVar3 < 0x11) {
      uVar3 = 0x20;
    }
    else {
      uVar3 = uVar3 - 1;
      if (uVar3 == 0) {
        bVar2 = 0;
      }
      else {
        iVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        bVar2 = (byte)iVar1 ^ 0x1f;
      }
      uVar3 = 1 << (0x21 - bVar2 & 0x1f);
    }
    this->CurArraySize = uVar3;
    this->NumNonEmpty = 0;
    this->NumTombstones = 0;
    __s = (void **)safe_malloc((ulong)uVar3 << 3);
    this->CurArray = __s;
    memset(__s,0xff,(ulong)this->CurArraySize << 3);
    return;
  }
  __assert_fail("!isSmall() && \"Can\'t shrink a small set!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                ,0x1a,"void llvm::SmallPtrSetImplBase::shrink_and_clear()");
}

Assistant:

void SmallPtrSetImplBase::shrink_and_clear() {
  assert(!isSmall() && "Can't shrink a small set!");
  free(CurArray);

  // Reduce the number of buckets.
  unsigned Size = size();
  CurArraySize = Size > 16 ? 1 << (Log2_32_Ceil(Size) + 1) : 32;
  NumNonEmpty = NumTombstones = 0;

  // Install the new array.  Clear all the buckets to empty.
  CurArray = (const void**)safe_malloc(sizeof(void*) * CurArraySize);

  memset(CurArray, -1, CurArraySize*sizeof(void*));
}